

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void __thiscall
ActionPrototypeTypes::extendInput
          (ActionPrototypeTypes *this,Funcdata *data,Varnode *invn,ProtoParameter *param,
          BlockBasic *topbl)

{
  int4 size;
  int iVar1;
  type_metatype tVar2;
  FuncProto *this_00;
  Address *addr;
  undefined4 extraout_var;
  undefined1 local_78 [32];
  PcodeOp *local_58;
  PcodeOp *op;
  undefined1 local_48 [4];
  OpCode res;
  VarnodeData vdata;
  BlockBasic *topbl_local;
  ProtoParameter *param_local;
  Varnode *invn_local;
  Funcdata *data_local;
  ActionPrototypeTypes *this_local;
  
  vdata._16_8_ = topbl;
  this_00 = Funcdata::getFuncProto(data);
  addr = Varnode::getAddr(invn);
  size = Varnode::getSize(invn);
  op._4_4_ = FuncProto::assumedInputExtension(this_00,addr,size,(VarnodeData *)local_48);
  if (op._4_4_ != CPUI_COPY) {
    if (op._4_4_ == CPUI_PIECE) {
      iVar1 = (*param->_vptr_ProtoParameter[3])();
      tVar2 = Datatype::getMetatype((Datatype *)CONCAT44(extraout_var,iVar1));
      if (tVar2 == TYPE_INT) {
        op._4_4_ = CPUI_INT_SEXT;
      }
      else {
        op._4_4_ = CPUI_INT_ZEXT;
      }
    }
    (**(code **)(*(long *)vdata._16_8_ + 0x10))(local_78 + 0x10);
    local_58 = Funcdata::newOp(data,1,(Address *)(local_78 + 0x10));
    VarnodeData::getAddr((VarnodeData *)local_78);
    Funcdata::newVarnodeOut(data,(int4)vdata.offset,(Address *)local_78,local_58);
    Funcdata::opSetOpcode(data,local_58,op._4_4_);
    Funcdata::opSetInput(data,local_58,invn,0);
    Funcdata::opInsertBegin(data,local_58,(BlockBasic *)vdata._16_8_);
  }
  return;
}

Assistant:

void ActionPrototypeTypes::extendInput(Funcdata &data,Varnode *invn,ProtoParameter *param,BlockBasic *topbl)

{
  VarnodeData vdata;
  OpCode res = data.getFuncProto().assumedInputExtension(invn->getAddr(),invn->getSize(),vdata);
  if (res == CPUI_COPY) return;		// no extension
  if (res == CPUI_PIECE) {	// Do an extension based on type of parameter
    if (param->getType()->getMetatype() == TYPE_INT)
      res = CPUI_INT_SEXT;
    else
      res = CPUI_INT_ZEXT;
  }
  PcodeOp *op = data.newOp(1,topbl->getStart());
  data.newVarnodeOut(vdata.size,vdata.getAddr(),op);
  data.opSetOpcode(op,res);
  data.opSetInput(op,invn,0);
  data.opInsertBegin(op,topbl);
}